

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_ext_instance_free(lysf_ctx *ctx,lysp_ext_instance *ext)

{
  lysp_stmt *plVar1;
  lysp_ext_instance *local_48;
  lysp_ext_instance *local_30;
  uint64_t c__;
  lysp_stmt *next;
  lysp_stmt *stmt;
  lysp_ext_instance *ext_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argument);
  ly_free_prefix_data(ext->format,ext->prefix_data);
  if ((ext->record != (lyplg_ext_record *)0x0) &&
     ((ext->record->plugin).pfree != (lyplg_ext_parse_free_clb)0x0)) {
    (*(ext->record->plugin).pfree)(ctx->ctx,ext);
  }
  next = ext->child;
  while (next != (lysp_stmt *)0x0) {
    plVar1 = next->next;
    lysp_stmt_free(ctx->ctx,next);
    next = plVar1;
  }
  local_30 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (ext->exts == (lysp_ext_instance *)0x0) {
      local_48 = (lysp_ext_instance *)0x0;
    }
    else {
      local_48 = ext->exts[-1].exts;
    }
    if (local_48 <= local_30) break;
    lysp_ext_instance_free(ctx,ext->exts + (long)local_30);
    local_30 = (lysp_ext_instance *)((long)&local_30->name + 1);
  }
  if (ext->exts != (lysp_ext_instance *)0x0) {
    free(&ext->exts[-1].exts);
  }
  return;
}

Assistant:

void
lysp_ext_instance_free(struct lysf_ctx *ctx, struct lysp_ext_instance *ext)
{
    struct lysp_stmt *stmt, *next;

    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argument);
    ly_free_prefix_data(ext->format, ext->prefix_data);
    if (ext->record && ext->record->plugin.pfree) {
        ext->record->plugin.pfree(ctx->ctx, ext);
    }

    LY_LIST_FOR_SAFE(ext->child, next, stmt) {
        lysp_stmt_free(ctx->ctx, stmt);
    }

    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
}